

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# go_destruct.cc
# Opt level: O0

void __thiscall re2c::SwitchIf::~SwitchIf(SwitchIf *this)

{
  Cases *this_00;
  If *this_01;
  SwitchIf *this_local;
  
  if (this->type == SWITCH) {
    this_00 = (this->info).cases;
    if (this_00 != (Cases *)0x0) {
      Cases::~Cases(this_00);
      operator_delete(this_00,0x18);
    }
  }
  else if ((this->type == IF) && (this_01 = (this->info).ifs, this_01 != (If *)0x0)) {
    If::~If(this_01);
    operator_delete(this_01,0x10);
  }
  return;
}

Assistant:

SwitchIf::~SwitchIf ()
{
	switch (type)
	{
		case SWITCH:
			delete info.cases;
			break;
		case IF:
			delete info.ifs;
			break;
	}
}